

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::value::color4f>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::value::color4f> *this,
          TypedAttributeWithFallback<tinyusdz::value::color4f> *param_1)

{
  undefined3 uVar1;
  float fVar2;
  TypedAttributeWithFallback<tinyusdz::value::color4f> *param_1_local;
  TypedAttributeWithFallback<tinyusdz::value::color4f> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::value::color4f>::optional<tinyusdz::value::color4f,_0>
            (&this->_attrib,&param_1->_attrib);
  uVar1 = *(undefined3 *)&param_1->field_0x235;
  fVar2 = (param_1->_fallback).r;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x235 = uVar1;
  (this->_fallback).r = fVar2;
  fVar2 = (param_1->_fallback).b;
  (this->_fallback).g = (param_1->_fallback).g;
  (this->_fallback).b = fVar2;
  (this->_fallback).a = (param_1->_fallback).a;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }